

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::TxGetChange(CWallet *wallet,CTransaction *tx)

{
  pointer pCVar1;
  CAmount CVar2;
  runtime_error *this;
  ulong uVar3;
  pointer txout;
  long in_FS_OFFSET;
  allocator<char> local_89;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock3,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/receive.cpp"
             ,0x58,false);
  txout = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start;
  pCVar1 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (txout == pCVar1) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar3;
      }
      goto LAB_001cdfb8;
    }
    CVar2 = OutputGetChange(wallet,txout);
    uVar3 = uVar3 + CVar2;
    txout = txout + 1;
  } while (uVar3 < 0x775f05a074001);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"TxGetChange",&local_89);
  std::operator+(&local_58,&local_78,": value out of range");
  std::runtime_error::runtime_error(this,(string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001cdfb8:
  __stack_chk_fail();
}

Assistant:

CAmount TxGetChange(const CWallet& wallet, const CTransaction& tx)
{
    LOCK(wallet.cs_wallet);
    CAmount nChange = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nChange += OutputGetChange(wallet, txout);
        if (!MoneyRange(nChange))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nChange;
}